

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cc
# Opt level: O1

int __thiscall RpcClient::PollResponse(RpcClient *this)

{
  NarpcStaging *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar2;
  ostream *poVar3;
  int size;
  unsigned_long_long ticket;
  shared_ptr<RpcMessage> local_58;
  shared_ptr<RpcMessage> local_48;
  int local_34;
  unsigned_long_long local_30;
  
  this_00 = &this->staging_;
  NarpcStaging::Clear(this_00);
  local_34 = 0;
  local_30 = 0;
  NarpcStaging::FetchHeader(this_00,this->socket_,&local_34,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"receiving size ",0xf);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ticket ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  peVar1 = this->responseMap_[local_30].super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_01 = this->responseMap_[local_30].super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  NarpcStaging::Clear(this_00);
  iVar2 = this->socket_;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_48.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_48.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_01;
  NarpcStaging::FetchMessage(this_00,iVar2,&local_48);
  if (local_48.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RpcMessage::PollResponse ",0x19);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_58.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_58.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_01;
  poVar3 = operator<<((ostream *)&std::cout,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (size ",7);
  iVar2 = (*peVar1->_vptr_RpcMessage[3])(peVar1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_58.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return 0;
}

Assistant:

int RpcClient::PollResponse() {
  // stream_.Clear();
  staging_.Clear();

  // recv narpc header
  // stream_.Read(socket_, kNarpcHeader);

  // int msg_size = stream_.GetInt();
  // long long msg_ticket = stream_.GetLong();
  int size = 0;
  unsigned long long ticket = 0;
  staging_.FetchHeader(socket_, size, ticket);

  cout << "receiving size " << size << ", ticket " << ticket << endl;
  shared_ptr<RpcMessage> response = responseMap_[ticket];

  // stream_.Read(socket_, msg_size);
  // msg_response->Update(stream_);
  staging_.Clear();
  staging_.FetchMessage(socket_, response);
  cout << "RpcMessage::PollResponse " << response << " (size "
       << response->Size() << ")" << endl;

  return 0;
}